

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3HexToBlob(sqlite3 *db,char *z,int n)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  pvVar1 = sqlite3DbMallocRawNN(db,(ulong)(n / 2 + 1));
  if (pvVar1 != (void *)0x0) {
    if (n < 2) {
      lVar2 = 0;
    }
    else {
      lVar2 = 0;
      lVar3 = 0;
      do {
        *(byte *)((long)pvVar1 + lVar2) =
             ((char)(z[lVar3 + 1] * '\x02') >> 7 & 9U) + z[lVar3 + 1] & 0xf |
             (((char)(z[lVar3] * '\x02') >> 7 & 9U) + z[lVar3]) * '\x10';
        lVar3 = lVar3 + 2;
        lVar2 = lVar2 + 1;
      } while (lVar3 < n + -1);
    }
    *(undefined1 *)((long)pvVar1 + lVar2) = 0;
  }
  return pvVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3HexToBlob(sqlite3 *db, const char *z, int n){
  char *zBlob;
  int i;

  zBlob = (char *)sqlite3DbMallocRawNN(db, n/2 + 1);
  n--;
  if( zBlob ){
    for(i=0; i<n; i+=2){
      zBlob[i/2] = (sqlite3HexToInt(z[i])<<4) | sqlite3HexToInt(z[i+1]);
    }
    zBlob[i/2] = 0;
  }
  return zBlob;
}